

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

AutoFile * __thiscall
node::BlockManager::OpenUndoFile
          (AutoFile *__return_storage_ptr__,BlockManager *this,FlatFilePos *pos,bool fReadOnly)

{
  long lVar1;
  FILE *file;
  long in_FS_OFFSET;
  _Vector_impl_data in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  file = FlatFileSeq::Open(&this->m_undo_file_seq,pos,fReadOnly);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)&stack0xffffffffffffffc0,
             &this->m_xor_key);
  AutoFile::AutoFile(__return_storage_ptr__,file,
                     (vector<std::byte,_std::allocator<std::byte>_>)in_stack_ffffffffffffffb8);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&stack0xffffffffffffffc0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

AutoFile BlockManager::OpenUndoFile(const FlatFilePos& pos, bool fReadOnly) const
{
    return AutoFile{m_undo_file_seq.Open(pos, fReadOnly), m_xor_key};
}